

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O0

Point __thiscall cppurses::Text_display::display_position(Text_display *this,size_t index)

{
  Point PVar1;
  size_t sVar2;
  vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_> *pvVar3;
  size_type sVar4;
  size_t last_shown_line;
  size_t line;
  size_t index_local;
  Text_display *this_local;
  Point position;
  
  Point::Point((Point *)&this_local);
  last_shown_line = line_at(this,index);
  sVar2 = top_line(this);
  if (sVar2 <= last_shown_line) {
    sVar2 = bottom_line(this);
    if (sVar2 < last_shown_line) {
      line = last_index_at(this,sVar2);
      last_shown_line = sVar2;
    }
    else {
      pvVar3 = &contents(this)->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>;
      sVar4 = std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::size(pvVar3);
      line = index;
      if (sVar4 < index) {
        pvVar3 = &contents(this)->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>;
        line = std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::size(pvVar3);
      }
    }
    sVar2 = top_line(this);
    position.x = last_shown_line - sVar2;
    sVar2 = first_index_at(this,last_shown_line);
    this_local = (Text_display *)(line - sVar2);
  }
  PVar1.y = position.x;
  PVar1.x = (size_t)this_local;
  return PVar1;
}

Assistant:

Point Text_display::display_position(std::size_t index) const {
    Point position;
    auto line = this->line_at(index);
    if (line < this->top_line()) {
        return position;
    }
    const auto last_shown_line = this->bottom_line();
    if (line > last_shown_line) {
        line = last_shown_line;
        index = this->last_index_at(line);
    } else if (index > this->contents().size()) {
        index = this->contents().size();
    }
    position.y = line - this->top_line();
    position.x = index - this->first_index_at(line);
    return position;
}